

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall UiWindow::UiWindow(UiWindow *this,Image *image,string *title)

{
  string *in_RDX;
  ImageTemplate<unsigned_char> *in_RDI;
  
  in_RDI->_vptr_ImageTemplate = (_func_int **)&PTR__UiWindow_0014ec78;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_RDI,(ImageTemplate<unsigned_char> *)&in_RDI->_width);
  std::__cxx11::string::string((string *)&in_RDI[1]._width,in_RDX);
  *(undefined1 *)&in_RDI[2]._vptr_ImageTemplate = 0;
  return;
}

Assistant:

UiWindow::UiWindow( const PenguinV_Image::Image & image, const std::string & title )
    : _image( image )
    , _title( title )
    , _shown( false )
{
}